

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void anon_unknown.dwarf_7fa20::testNumbers(void)

{
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testHalfToUint(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testFloatToHalf(unaff_retaddr_00,unaff_retaddr);
  testUintToHalf(unaff_retaddr_00,unaff_retaddr);
  testUintToHalf(unaff_retaddr_00,unaff_retaddr);
  testUintToHalf(unaff_retaddr_00,unaff_retaddr);
  testUintToHalf(unaff_retaddr_00,unaff_retaddr);
  testUintToHalf(unaff_retaddr_00,unaff_retaddr);
  return;
}

Assistant:

void
testNumbers ()
{
    testFloatToUint (0x00000000, 0);          //  0.0
    testFloatToUint (0x3f000000, 0);          // +0.5
    testFloatToUint (0xbf000000, 0);          // -0.5
    testFloatToUint (0x42f82000, 124);        // +124.0625
    testFloatToUint (0xc2f82000, 0);          // -124.0625
    testFloatToUint (0x58635fa9, 0xffffffff); // +1.0e15
    testFloatToUint (0xd8635fa9, 0);          // -1.0e15
    testFloatToUint (0x7f800000, 0xffffffff); // +infinity
    testFloatToUint (0xff800000, 0);          // -infinity
    testFloatToUint (0x7fffffff, 0);          //  NaN
    testFloatToUint (0xffffffff, 0);          //  NaN

    testHalfToUint (0x0000, 0);          //  0.0
    testHalfToUint (0x3800, 0);          // +0.5
    testHalfToUint (0xb800, 0);          // -0.5
    testHalfToUint (0x57c1, 124);        // +124.0625
    testHalfToUint (0xd7c1, 0);          // -124.0625
    testHalfToUint (0x7c00, 0xffffffff); // +infinity
    testHalfToUint (0xfc00, 0);          // -infinity
    testHalfToUint (0x7fff, 0);          //  NaN
    testHalfToUint (0xffff, 0);          //  NaN

    testFloatToHalf (0x00000000, 0x0000); //  0.0
    testFloatToHalf (0x3f000000, 0x3800); // +0.5
    testFloatToHalf (0xbf000000, 0xb800); // -0.5
    testFloatToHalf (0x42f82000, 0x57c1); // +124.0625
    testFloatToHalf (0xc2f82000, 0xd7c1); // -124.0625
    testFloatToHalf (0x58635fa9, 0x7c00); // +1.0e15
    testFloatToHalf (0xd8635fa9, 0xfc00); // -1.0e15
    testFloatToHalf (0x7f800000, 0x7c00); // +infinity
    testFloatToHalf (0xff800000, 0xfc00); // -infinity
    testFloatToHalf (0x7fffffff, 0x7fff); //  NaN
    testFloatToHalf (0xffffffff, 0xffff); //  NaN

    testUintToHalf (0, 0x0000);
    testUintToHalf (1, 0x3c00);
    testUintToHalf (124, 0x57c0);
    testUintToHalf (1000000, 0x7c00);
    testUintToHalf (0xffffffff, 0x7c00);
}